

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_tonumber(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  int iVar3;
  uint uVar4;
  TValue tmp;
  TValue local_20;
  
  uVar4 = *J->base;
  uVar1 = J->base[1];
  if (((uVar1 & 0x1f000000) != 0 && uVar4 != 0) &&
     ((TVar2 = lj_opt_narrow_toint(J,uVar1), (short)TVar2 < 0 ||
      ((J->cur).ir[TVar2 & 0x7fff].field_1.op12 != 10)))) {
    recff_nyi(J,rd);
    return;
  }
  uVar1 = uVar4 & 0x1f000000;
  if ((uVar4 >> 0x18 & 0x1e) - 0xe < 6) {
    if (uVar1 != 0x4000000) goto LAB_0013816e;
  }
  else if (uVar1 != 0x4000000) {
    uVar4 = 0x7fff;
    if (uVar1 == 0xa000000) {
      lj_crecord_tonumber(J,rd);
      return;
    }
    goto LAB_0013816e;
  }
  iVar3 = lj_strscan_num((GCstr *)(ulong)(rd->argv->u32).lo,&local_20);
  if (iVar3 == 0) {
    recff_nyi(J,rd);
    return;
  }
  (J->fold).ins.field_0.op1 = (IRRef1)uVar4;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5c8e0000;
  uVar4 = lj_opt_fold(J);
LAB_0013816e:
  *J->base = uVar4;
  return;
}

Assistant:

static void LJ_FASTCALL recff_tonumber(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  TRef base = J->base[1];
  if (tr && !tref_isnil(base)) {
    base = lj_opt_narrow_toint(J, base);
    if (!tref_isk(base) || IR(tref_ref(base))->i != 10) {
      recff_nyiu(J, rd);
      return;
    }
  }
  if (tref_isnumber_str(tr)) {
    if (tref_isstr(tr)) {
      TValue tmp;
      if (!lj_strscan_num(strV(&rd->argv[0]), &tmp)) {
	recff_nyiu(J, rd);  /* Would need an inverted STRTO for this case. */
	return;
      }
      tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    }
#if LJ_HASFFI
  } else if (tref_iscdata(tr)) {
    lj_crecord_tonumber(J, rd);
    return;
#endif
  } else {
    tr = TREF_NIL;
  }
  J->base[0] = tr;
  UNUSED(rd);
}